

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

char * bstr2cstr(bstring b,char z)

{
  uchar *puVar1;
  char *pcVar2;
  ulong uVar3;
  uchar uVar4;
  ulong uVar5;
  
  if (b != (bstring)0x0) {
    uVar5 = (ulong)(uint)b->slen;
    if (((b->slen < 0) || (puVar1 = b->data, puVar1 == (uchar *)0x0)) ||
       (pcVar2 = (char *)malloc(uVar5 + 1), pcVar2 == (char *)0x0)) {
      pcVar2 = (char *)0x0;
    }
    else {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar3 = 0;
        do {
          uVar4 = puVar1[uVar3];
          if (uVar4 == '\0') {
            uVar4 = z;
          }
          pcVar2[uVar3] = uVar4;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      pcVar2[uVar5] = '\0';
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char * bstr2cstr (const bstring b, char z) {
int i,l;
char * r;

	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;
	l = b->slen;
	r = (char *) bstr__alloc (l + 1);
	if (r == NULL) return r;

	for (i=0; i < l; i ++) {
		r[i] = (char) ((b->data[i] == '\0') ? z : (char) (b->data[i]));
	}

	r[l] = (unsigned char) '\0';

	return r;
}